

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setPatternPartitions
          (BeagleCPUImpl<double,_1,_0> *this,int partitionCount,int *inPatternPartitions)

{
  mutex_type *__m;
  uint uVar1;
  shared_future<void> *psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int *piVar4;
  undefined1 auVar5 [16];
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  long *plVar10;
  int **ppiVar11;
  undefined8 *puVar12;
  int i;
  long lVar13;
  int iVar14;
  int iVar15;
  int i_1;
  long lVar16;
  long lVar17;
  byte bVar18;
  int i_2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  threadData *ptVar20;
  ulong uVar21;
  bool bVar22;
  threadData *local_58;
  BeagleCPUImpl<double,_1,_0> *local_50;
  unique_lock<std::mutex> l;
  thread local_38;
  
  this->kPartitionCount = partitionCount;
  bVar18 = this->kPartitionsInitialised;
  if ((bool)bVar18 == false) {
    piVar6 = (int *)malloc((long)this->kPatternCount << 2);
    this->gPatternPartitions = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_0012c73b;
    if (this->kAutoPartitioningEnabled == true) {
      free(this->gAutoPartitionOperations);
      if (this->kAutoRootPartitioningEnabled == true) {
        free(this->gAutoPartitionIndices);
        free(this->gAutoPartitionOutSumLogLikelihoods);
        this->kAutoRootPartitioningEnabled = false;
      }
      this->kAutoPartitioningEnabled = false;
      bVar18 = this->kPartitionsInitialised;
    }
  }
  uVar21 = (ulong)partitionCount;
  if (((bVar18 & 1) == 0) || (this->kMaxPartitionCount < partitionCount)) {
    if ((bVar18 & 1) != 0) {
      free(this->gPatternPartitionsStartPatterns);
    }
    piVar6 = (int *)malloc(uVar21 * 4 + 4);
    this->gPatternPartitionsStartPatterns = piVar6;
    if (piVar6 == (int *)0x0) {
LAB_0012c73b:
      puVar12 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar12 = __cxa_init_primary_exception;
      __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    this->kMaxPartitionCount = partitionCount;
  }
  if (this->kThreadingEnabled == true) {
    lVar17 = 0x58;
    for (lVar13 = 0; uVar7 = (ulong)this->kNumThreads, lVar13 < (long)uVar7; lVar13 = lVar13 + 1) {
      __m = (mutex_type *)
            ((long)&(this->gThreads->jobs).c.
                    super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node + lVar17);
      std::unique_lock<std::mutex>::unique_lock(&l,__m);
      __m[1].super___mutex_base._M_mutex.__size[0] = '\x01';
      std::condition_variable::notify_one();
      std::unique_lock<std::mutex>::~unique_lock(&l);
      lVar17 = lVar17 + 0xb8;
    }
    for (lVar17 = 0; ptVar20 = this->gThreads, lVar17 < (int)uVar7; lVar17 = lVar17 + 1) {
      std::thread::join();
      uVar7 = (ulong)(uint)this->kNumThreads;
    }
    if (ptVar20 != (threadData *)0x0) {
      if (*(long *)&ptVar20[-1].stop != 0) {
        lVar17 = *(long *)&ptVar20[-1].stop * 0xb8;
        do {
          threadData::~threadData((threadData *)((long)&ptVar20[-1].t._M_id._M_thread + lVar17));
          lVar17 = lVar17 + -0xb8;
        } while (lVar17 != 0);
      }
      operator_delete__(&ptVar20[-1].stop);
    }
    psVar2 = this->gFutures;
    if (psVar2 != (shared_future<void> *)0x0) {
      p_Var3 = psVar2[-1].super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      p_Var19 = &psVar2[-1].super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        lVar17 = (long)p_Var3 << 4;
        do {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&p_Var19->_M_pi + lVar17))
          ;
          lVar17 = lVar17 + -0x10;
        } while (lVar17 != 0);
      }
      operator_delete__(p_Var19);
    }
    for (lVar17 = 0; lVar17 < this->kNumThreads; lVar17 = lVar17 + 1) {
      free(this->gThreadOperations[lVar17]);
    }
    free(this->gThreadOperations);
    free(this->gThreadOpCounts);
    this->kThreadingEnabled = false;
  }
  if ((this->kFlags & 0x40000000) != 0) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar21;
    uVar8 = SUB168(auVar5 * ZEXT816(0xb8),0);
    uVar7 = uVar8 + 8;
    if (0xfffffffffffffff7 < uVar8) {
      uVar7 = 0xffffffffffffffff;
    }
    this->kNumThreads = partitionCount;
    if (SUB168(auVar5 * ZEXT816(0xb8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    puVar9 = (ulong *)operator_new__(uVar7);
    *puVar9 = uVar21;
    if (partitionCount != 0) {
      lVar17 = 0;
      ptVar20 = (threadData *)(puVar9 + 1);
      do {
        threadData::threadData(ptVar20);
        lVar17 = lVar17 + -0xb8;
        ptVar20 = ptVar20 + 1;
      } while (uVar21 * -0xb8 - lVar17 != 0);
    }
    this->gThreads = (threadData *)(puVar9 + 1);
    lVar17 = 0;
    lVar13 = 0;
    while( true ) {
      uVar1 = this->kNumThreads;
      lVar16 = (long)(int)uVar1;
      if (lVar16 <= lVar13) break;
      l._M_device = (mutex_type *)threadWaiting;
      l._M_owns = false;
      l._9_7_ = 0;
      local_58 = (threadData *)((long)&(this->gThreads->t)._M_id._M_thread + lVar17);
      local_50 = this;
      std::thread::
      thread<void(beagle::cpu::BeagleCPUImpl<double,1,0>::*)(beagle::cpu::BeagleCPUImpl<double,1,0>::threadData*),beagle::cpu::BeagleCPUImpl<double,1,0>*,beagle::cpu::BeagleCPUImpl<double,1,0>::threadData*,void>
                (&local_38,(type *)&l,&local_50,&local_58);
      std::thread::operator=
                ((thread *)((long)&(this->gThreads->t)._M_id._M_thread + lVar17),&local_38);
      std::thread::~thread(&local_38);
      lVar13 = lVar13 + 1;
      lVar17 = lVar17 + 0xb8;
    }
    uVar7 = lVar16 * 0x10 + 8;
    if ((int)uVar1 < 0) {
      uVar7 = 0xffffffffffffffff;
    }
    plVar10 = (long *)operator_new__(uVar7);
    *plVar10 = lVar16;
    if (uVar1 != 0) {
      memset((shared_future<void> *)(plVar10 + 1),0,lVar16 * 0x10);
    }
    this->gFutures = (shared_future<void> *)(plVar10 + 1);
    ppiVar11 = (int **)malloc(lVar16 * 8);
    this->gThreadOperations = ppiVar11;
    iVar14 = *(int *)&(this->super_BeagleImpl).field_0xc;
    for (uVar7 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar7; uVar7 = uVar7 + 1) {
      piVar6 = (int *)malloc(uVar21 * (long)iVar14 * 0x24);
      this->gThreadOperations[uVar7] = piVar6;
    }
    piVar6 = (int *)malloc(lVar16 << 2);
    this->gThreadOpCounts = piVar6;
    this->kThreadingEnabled = true;
  }
  memcpy(this->gPatternPartitions,inPatternPartitions,(long)this->kPatternCount << 2);
  piVar6 = this->gPatternPartitions;
  uVar21 = 0;
  iVar14 = 0;
  do {
    if ((uint)(~(this->kPatternCount >> 0x1f) & this->kPatternCount) == uVar21) {
      uVar21 = (ulong)*piVar6;
      piVar4 = this->gPatternPartitionsStartPatterns;
      lVar17 = 0;
      piVar4[uVar21] = 0;
      while( true ) {
        if (this->kPatternCount <= lVar17) break;
        uVar1 = piVar6[lVar17];
        if (uVar1 != (uint)uVar21) {
          piVar4[(int)uVar1] = (int)lVar17;
          uVar21 = (ulong)uVar1;
        }
        lVar17 = lVar17 + 1;
      }
      piVar4[(long)(int)(uint)uVar21 + 1] = this->kPatternCount;
      iVar14 = 0;
      goto LAB_0012c728;
    }
    if (uVar21 == 0) {
      iVar15 = *piVar6;
    }
    else {
      iVar15 = piVar6[uVar21];
      iVar14 = iVar14 + (uint)(iVar15 != piVar6[uVar21 - 1]);
    }
    uVar21 = uVar21 + 1;
    bVar22 = iVar14 == iVar15;
    iVar14 = iVar15;
  } while (bVar22);
  iVar14 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x40])(this);
LAB_0012c728:
  this->kPartitionsInitialised = true;
  return iVar14;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setPatternPartitions(int partitionCount,
                                                            const int* inPatternPartitions) {

    int returnCode = BEAGLE_SUCCESS;

    assert(partitionCount > 0);
    assert(inPatternPartitions != 0L);

    kPartitionCount = partitionCount;

    if (!kPartitionsInitialised) {
        gPatternPartitions = (int*) malloc(sizeof(int) * kPatternCount);
        if (gPatternPartitions == NULL)
            throw std::bad_alloc();

        if (kAutoPartitioningEnabled) {
            free(gAutoPartitionOperations);
            if (kAutoRootPartitioningEnabled) {
                free(gAutoPartitionIndices);
                free(gAutoPartitionOutSumLogLikelihoods);
                kAutoRootPartitioningEnabled = false;
            }
            kAutoPartitioningEnabled = false;
        }
    }
    if (!kPartitionsInitialised || partitionCount > kMaxPartitionCount) {
        if (kPartitionsInitialised) {
            free(gPatternPartitionsStartPatterns);
        }
        gPatternPartitionsStartPatterns = (int*) malloc(sizeof(int) * (partitionCount+1));
        if (gPatternPartitionsStartPatterns == NULL)
            throw std::bad_alloc();

        kMaxPartitionCount = partitionCount;
    }

    if (kThreadingEnabled) {
        // Send stop signal to all threads and join them...
        for (int i = 0; i < kNumThreads; i++) {
            threadData* td = &gThreads[i];
            std::unique_lock<std::mutex> l(td->m);
            td->stop = true;
            td->cv.notify_one();
        }

        // Join all the threads
        for (int i = 0; i < kNumThreads; i++) {
            threadData* td = &gThreads[i];
            td->t.join();
        }

        delete[] gThreads;
        delete[] gFutures;

        for (int i=0; i<kNumThreads; i++) {
            free(gThreadOperations[i]);
        }
        free(gThreadOperations);
        free(gThreadOpCounts);

        kThreadingEnabled = false;
    }

    if (kFlags & BEAGLE_FLAG_THREADING_CPP) {
        kNumThreads = partitionCount;

        gThreads = new threadData[kNumThreads];
        for (int i = 0; i < kNumThreads; i++) {
            gThreads[i].t = std::thread(&BeagleCPUImpl<BEAGLE_CPU_GENERIC>::threadWaiting, this, &gThreads[i]);
        }

        gFutures = new std::shared_future<void>[kNumThreads];
        if (gFutures == NULL)
            throw std::bad_alloc();

        gThreadOperations = (int**) malloc(sizeof(int*) * kNumThreads);
        for (int i=0; i<kNumThreads; i++) {
            gThreadOperations[i] = (int*) malloc(sizeof(int) * BEAGLE_PARTITION_OP_COUNT * kBufferCount * partitionCount);
        }

        gThreadOpCounts = (int*) malloc(sizeof(int) * kNumThreads);

        kThreadingEnabled = true;
    }


    memcpy(gPatternPartitions, inPatternPartitions, sizeof(int) * kPatternCount);

    bool reorderPatterns = false;
    int contiguousPartitions = 0;
    for (int i=0; i<kPatternCount; i++) {
        if (i > 0 && (gPatternPartitions[i] != gPatternPartitions[i-1])) {
            contiguousPartitions++;
        }
        if (contiguousPartitions != gPatternPartitions[i]) {
            reorderPatterns = true;
            break;
        }
    }

    if (reorderPatterns) {
        returnCode = reorderPatternsByPartition();
    } else {
        int currentPartition = gPatternPartitions[0];
        gPatternPartitionsStartPatterns[currentPartition] = 0;
        for (int i=0; i<kPatternCount; i++) {
            if (gPatternPartitions[i] != currentPartition) {
                currentPartition = gPatternPartitions[i];
                gPatternPartitionsStartPatterns[currentPartition] = i;
            }
        }
        gPatternPartitionsStartPatterns[currentPartition+1] = kPatternCount;
    }

    kPartitionsInitialised = true;

    return returnCode;
}